

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O3

vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> * __thiscall
anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>::spans_v
          (vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *__return_storage_ptr__,
          Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_> *this)

{
  undefined8 uVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer pIVar6;
  int iVar7;
  undefined4 extraout_var;
  Index IVar8;
  undefined4 extraout_var_00;
  Index IVar9;
  long lVar10;
  long lVar11;
  double value;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *result;
  undefined8 local_58;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_48;
  
  peVar2 = (this->m_surface_geometry).m_entry.
           super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar3 = (peVar2->m_data).
           super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (peVar2->m_data).
           super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    lVar10 = *(long *)&(peVar3->m_knots_v).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
    lVar11 = (peVar3->m_knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if (lVar11 < 0 && lVar10 != 0) goto LAB_00283ce8;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
    lVar10 = *(long *)&(peVar3->m_knots_v).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
    lVar11 = (peVar3->m_knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if (lVar11 < 0 && lVar10 != 0) {
LAB_00283ce8:
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/MapBase.h"
                    ,0xb0,
                    "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
                   );
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  iVar7 = (*(this->super_SurfaceBase<3L>)._vptr_SurfaceBase[3])(this);
  (*(this->super_SurfaceBase<3L>)._vptr_SurfaceBase[5])(this);
  local_48.
  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
  _0_8_ = lVar10;
  local_48.
  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
  _8_8_ = lVar11;
  IVar8 = Nurbs::upper_bound<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                    (&local_48,CONCAT44(extraout_var,iVar7),lVar11 - CONCAT44(extraout_var,iVar7),
                     value);
  iVar7 = (*(this->super_SurfaceBase<3L>)._vptr_SurfaceBase[3])(this);
  (*(this->super_SurfaceBase<3L>)._vptr_SurfaceBase[5])(this);
  local_48.
  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
  _0_8_ = lVar10;
  local_48.
  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
  _8_8_ = lVar11;
  IVar9 = Nurbs::lower_bound<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                    (&local_48,CONCAT44(extraout_var_00,iVar7),
                     lVar11 - CONCAT44(extraout_var_00,iVar7),
                     (double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
  std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::vector
            (__return_storage_ptr__,(IVar9 - IVar8) + 1,(allocator_type *)&local_48);
  if (-1 < IVar9 - IVar8) {
    lVar10 = 8;
    do {
      peVar2 = (this->m_surface_geometry).m_entry.
               super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      p_Var4 = (this->m_surface_geometry).m_entry.
               super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      peVar3 = (peVar2->m_data).
               super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var5 = (peVar2->m_data).
               super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      if ((IVar8 + -1 < 0) ||
         ((peVar3->m_knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows <= IVar8 + -1)) {
LAB_00283cc9:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x198,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      uVar1 = *(undefined8 *)
               (*(long *)&(peVar3->m_knots_v).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage +
                -8 + IVar8 * 8);
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      peVar2 = (this->m_surface_geometry).m_entry.
               super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      p_Var4 = (this->m_surface_geometry).m_entry.
               super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      peVar3 = (peVar2->m_data).
               super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var5 = (peVar2->m_data).
               super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if ((peVar3->m_knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows <= IVar8) goto LAB_00283cc9;
        local_58 = *(undefined8 *)
                    (*(long *)&(peVar3->m_knots_v).
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage + IVar8 * 8);
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
        if ((peVar3->m_knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows <= IVar8) goto LAB_00283cc9;
        local_58 = *(undefined8 *)
                    (*(long *)&(peVar3->m_knots_v).
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage + IVar8 * 8);
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
      }
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      pIVar6 = (__return_storage_ptr__->
               super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *(undefined8 *)((long)pIVar6 + lVar10 + -8) = uVar1;
      *(undefined8 *)((long)&pIVar6->m_t0 + lVar10) = local_58;
      IVar8 = IVar8 + 1;
      lVar10 = lVar10 + 0x10;
    } while (IVar9 + 1 != IVar8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Interval> spans_v() const override
    {
        auto knots = m_surface_geometry->knots_v();

        Index first_span = Nurbs::upper_span(degree_v(), knots, domain_v().t0());
        Index last_span = Nurbs::lower_span(degree_v(), knots, domain_v().t1());

        Index nb_spans = last_span - first_span + 1;

        std::vector<Interval> result(nb_spans);

        for (Index i = 0; i < nb_spans; i++) {
            double v0 = surface_geometry()->knot_v(first_span + i);
            double v1 = surface_geometry()->knot_v(first_span + i + 1);

            result[i] = Interval(v0, v1);
        }

        return result;
    }